

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<capnp::ClientHook> * __thiscall
kj::Own<capnp::ClientHook>::operator=(Own<capnp::ClientHook> *this,Own<capnp::ClientHook> *other)

{
  Disposer *this_00;
  ClientHook *object;
  ClientHook *ptrCopy;
  Disposer *disposerCopy;
  Own<capnp::ClientHook> *other_local;
  Own<capnp::ClientHook> *this_local;
  
  this_00 = this->disposer;
  object = this->ptr;
  this->disposer = other->disposer;
  this->ptr = other->ptr;
  other->ptr = (ClientHook *)0x0;
  if (object != (ClientHook *)0x0) {
    Disposer::dispose<capnp::ClientHook>(this_00,object);
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assingnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    const Disposer* disposerCopy = disposer;
    T* ptrCopy = ptr;
    disposer = other.disposer;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      disposerCopy->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
    return *this;
  }